

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall
Catch::Section::Section(Section *this,SourceLineInfo *_lineInfo,StringRef _name,char *param_3)

{
  size_t sVar1;
  int iVar2;
  IResultCapture *pIVar3;
  uint64_t uVar4;
  char *pcVar5;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  pcVar5 = _name.m_start;
  local_50 = &local_40;
  (this->m_info).name._M_dataplus._M_p = (pointer)&(this->m_info).name.field_2;
  (this->m_info).name.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->m_info).name.field_2 + 1) = local_3f;
  *(undefined4 *)((long)&(this->m_info).name.field_2 + 9) = local_37;
  *(undefined2 *)((long)&(this->m_info).name.field_2 + 0xd) = local_33;
  (this->m_info).name.field_2._M_local_buf[0xf] = local_31;
  (this->m_info).name._M_string_length = 0;
  local_48 = 0;
  local_40 = 0;
  (this->m_info).lineInfo.file = "invalid";
  (this->m_info).lineInfo.line = 0xffffffffffffffff;
  (this->m_assertions).passed = 0;
  (this->m_assertions).failed = 0;
  (this->m_assertions).failedButOk = 0;
  (this->m_assertions).skipped = 0;
  pIVar3 = getResultCapture();
  iVar2 = (*pIVar3->_vptr_IResultCapture[3])
                    (pIVar3,pcVar5,_name.m_size,_lineInfo,&this->m_assertions);
  this->m_sectionIncluded = SUB41(iVar2,0);
  (this->m_timer).m_nanoseconds = 0;
  if (SUB41(iVar2,0) != false) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar5,pcVar5 + _name.m_size)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    sVar1 = _lineInfo->line;
    (this->m_info).lineInfo.file = _lineInfo->file;
    (this->m_info).lineInfo.line = sVar1;
    uVar4 = std::chrono::_V2::system_clock::now();
    (this->m_timer).m_nanoseconds = uVar4;
  }
  return;
}

Assistant:

Section::Section( SourceLineInfo const& _lineInfo,
                      StringRef _name,
                      const char* const ):
        m_info( { "invalid", static_cast<std::size_t>( -1 ) }, std::string{} ),
        m_sectionIncluded(
            getResultCapture().sectionStarted( _name, _lineInfo, m_assertions ) ) {
        // We delay initialization the SectionInfo member until we know
        // this section needs it, so we avoid allocating std::string for name.
        // We also delay timer start to avoid the potential syscall unless we
        // will actually use the result.
        if ( m_sectionIncluded ) {
            m_info.name = static_cast<std::string>( _name );
            m_info.lineInfo = _lineInfo;
            m_timer.start();
        }
    }